

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

wchar_t archive_read_open_filenames(archive *a,char **filenames,size_t block_size)

{
  int iVar1;
  wchar_t wVar2;
  size_t sVar3;
  undefined4 *client_data;
  bool bVar4;
  char *local_38;
  char *filename;
  read_file_data *mine;
  size_t block_size_local;
  char **filenames_local;
  archive *a_local;
  
  local_38 = (char *)0x0;
  block_size_local = (size_t)filenames;
  if (filenames != (char **)0x0) {
    block_size_local = (size_t)(filenames + 1);
    local_38 = *filenames;
  }
  archive_clear_error(a);
  do {
    if (local_38 == (char *)0x0) {
      local_38 = anon_var_dwarf_5228 + 3;
    }
    sVar3 = strlen(local_38);
    client_data = (undefined4 *)calloc(1,sVar3 + 0x38);
    if (client_data == (undefined4 *)0x0) {
      archive_set_error(a,0xc,"No memory");
      return L'\xffffffe2';
    }
    strcpy((char *)(client_data + 0xc),local_38);
    *(size_t *)(client_data + 2) = block_size;
    *client_data = 0xffffffff;
    *(undefined8 *)(client_data + 4) = 0;
    *(undefined1 *)(client_data + 10) = 0;
    client_data[6] = 0;
    if ((local_38 == (char *)0x0) || (*local_38 == '\0')) {
      client_data[0xb] = 0;
    }
    else {
      client_data[0xb] = 1;
    }
    iVar1 = archive_read_append_callback_data(a,client_data);
    if (iVar1 != 0) {
      return L'\xffffffe2';
    }
    if (block_size_local == 0) break;
    local_38 = *(char **)block_size_local;
    bVar4 = false;
    if (local_38 != (char *)0x0) {
      bVar4 = *local_38 != '\0';
    }
    block_size_local = block_size_local + 8;
  } while (bVar4);
  archive_read_set_open_callback(a,file_open);
  archive_read_set_read_callback(a,file_read);
  archive_read_set_skip_callback(a,file_skip);
  archive_read_set_close_callback(a,file_close);
  archive_read_set_switch_callback(a,file_switch);
  archive_read_set_seek_callback(a,file_seek);
  wVar2 = archive_read_open1(a);
  return wVar2;
}

Assistant:

int
archive_read_open_filenames(struct archive *a, const char **filenames,
    size_t block_size)
{
	struct read_file_data *mine;
	const char *filename = NULL;
	if (filenames)
		filename = *(filenames++);

	archive_clear_error(a);
	do
	{
		if (filename == NULL)
			filename = "";
		mine = calloc(1,
			sizeof(*mine) + strlen(filename));
		if (mine == NULL)
			goto no_memory;
		strcpy(mine->filename.m, filename);
		mine->block_size = block_size;
		mine->fd = -1;
		mine->buffer = NULL;
		mine->st_mode = mine->use_lseek = 0;
		if (filename == NULL || filename[0] == '\0') {
			mine->filename_type = FNT_STDIN;
		} else
			mine->filename_type = FNT_MBS;
		if (archive_read_append_callback_data(a, mine) != (ARCHIVE_OK))
			return (ARCHIVE_FATAL);
		if (filenames == NULL)
			break;
		filename = *(filenames++);
	} while (filename != NULL && filename[0] != '\0');
	archive_read_set_open_callback(a, file_open);
	archive_read_set_read_callback(a, file_read);
	archive_read_set_skip_callback(a, file_skip);
	archive_read_set_close_callback(a, file_close);
	archive_read_set_switch_callback(a, file_switch);
	archive_read_set_seek_callback(a, file_seek);

	return (archive_read_open1(a));
no_memory:
	archive_set_error(a, ENOMEM, "No memory");
	return (ARCHIVE_FATAL);
}